

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O0

void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  int iVar1;
  int iVar2;
  void *in_RSI;
  void *in_RDI;
  bool bVar3;
  secp256k1_modinv32_trans2x2 t;
  int32_t gn;
  int32_t fn;
  int32_t cond;
  int32_t eta;
  int len;
  int j;
  int i;
  secp256k1_modinv32_signed30 g;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 e;
  secp256k1_modinv32_signed30 d;
  uint local_b4;
  int local_ac;
  int in_stack_ffffffffffffff58;
  int iVar4;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  uint32_t in_stack_ffffffffffffff70;
  int32_t in_stack_ffffffffffffff74;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  secp256k1_modinv32_signed30 *in_stack_ffffffffffffff88;
  undefined4 local_58 [9];
  undefined1 local_34 [36];
  void *local_10;
  void *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(local_34,0,0x24);
  memset(local_58,0,0x24);
  local_58[0] = 1;
  memcpy(&stack0xffffffffffffff84,local_10,0x24);
  memcpy(&stack0xffffffffffffff60,local_8,0x24);
  iVar4 = 0;
  local_ac = 9;
  while( true ) {
    secp256k1_modinv32_divsteps_30_var
              (in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
               (secp256k1_modinv32_trans2x2 *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    secp256k1_modinv32_update_de_30
              ((secp256k1_modinv32_signed30 *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78,
               (secp256k1_modinv32_trans2x2 *)
               CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (secp256k1_modinv32_modinfo *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (iVar2 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x25b,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (0 < iVar2) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x25c,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0"
             );
      abort();
    }
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (iVar2 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x25d,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (-1 < iVar2) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x25e,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
    secp256k1_modinv32_update_fg_30_var
              (in_stack_ffffffffffffff74,
               (secp256k1_modinv32_signed30 *)
               CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (secp256k1_modinv32_signed30 *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (secp256k1_modinv32_trans2x2 *)CONCAT44(iVar4,in_stack_ffffffffffffff58));
    if (in_stack_ffffffffffffff60 == 0) {
      local_b4 = 0;
      for (in_stack_ffffffffffffff58 = 1; in_stack_ffffffffffffff58 < local_ac;
          in_stack_ffffffffffffff58 = in_stack_ffffffffffffff58 + 1) {
        local_b4 = *(uint *)(&stack0xffffffffffffff60 + (long)in_stack_ffffffffffffff58 * 4) |
                   local_b4;
      }
      if (local_b4 == 0) {
        iVar4 = secp256k1_modinv32_mul_cmp_30
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        if (iVar4 != 0) {
          fprintf(_stderr,"%s:%d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
                  ,0x284,
                  "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0"
                 );
          abort();
        }
        iVar4 = secp256k1_modinv32_mul_cmp_30
                          (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
        bVar3 = true;
        if (iVar4 != 0) {
          iVar4 = secp256k1_modinv32_mul_cmp_30
                            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                             in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
          bVar3 = true;
          if (iVar4 != 0) {
            iVar4 = secp256k1_modinv32_mul_cmp_30
                              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                               in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
            bVar3 = false;
            if (iVar4 == 0) {
              iVar4 = secp256k1_modinv32_mul_cmp_30
                                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                 in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
              bVar3 = false;
              if (iVar4 == 0) {
                iVar4 = secp256k1_modinv32_mul_cmp_30
                                  (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                                   in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
                bVar3 = iVar4 == 0;
              }
            }
          }
        }
        if (bVar3) {
          secp256k1_modinv32_normalize_30
                    ((secp256k1_modinv32_signed30 *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                     in_stack_ffffffffffffff6c,
                     (secp256k1_modinv32_modinfo *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          memcpy(local_8,local_34,0x24);
          return;
        }
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
                ,0x28a,
                "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 || secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 || (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 && secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0)"
               );
        abort();
      }
    }
    iVar2 = *(int *)(&stack0xffffffffffffff84 + (long)(local_ac + -1) * 4);
    iVar1 = *(int *)(&stack0xffffffffffffff60 + (long)(local_ac + -1) * 4);
    if (iVar1 == iVar1 >> 0x1f && (iVar2 == iVar2 >> 0x1f && -1 < local_ac + -2)) {
      *(uint *)(&stack0xffffffffffffff84 + (long)(local_ac + -2) * 4) =
           iVar2 << 0x1e | *(uint *)(&stack0xffffffffffffff84 + (long)(local_ac + -2) * 4);
      *(uint *)(&stack0xffffffffffffff60 + (long)(local_ac + -2) * 4) =
           iVar1 << 0x1e | *(uint *)(&stack0xffffffffffffff60 + (long)(local_ac + -2) * 4);
      local_ac = local_ac + -1;
    }
    iVar4 = iVar4 + 1;
    if (0x18 < iVar4) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x279,"test condition failed: ++i < 25");
      abort();
    }
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (iVar2 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x27a,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (0 < iVar2) break;
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (iVar2 < 1) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x27c,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0"
             );
      abort();
    }
    iVar2 = secp256k1_modinv32_mul_cmp_30
                      (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff78
                       ,in_stack_ffffffffffffff74);
    if (-1 < iVar2) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
              ,0x27d,
              "test condition failed: secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0"
             );
      abort();
    }
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/sipsorcery[P]bitcoin/src/secp256k1/src/modinv32_impl.h"
          ,0x27b,
          "test condition failed: secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0"
         );
  abort();
}

Assistant:

static void secp256k1_modinv32_var(secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 d = {{0, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 e = {{1, 0, 0, 0, 0, 0, 0, 0, 0}};
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 (faster for the variable-time code) */
    int32_t cond, fn, gn;

    /* Do iterations of 30 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 30 divsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_divsteps_30_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv32_update_de_30(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of g is 0, there is a chance g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if all other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn ^ (fn >> 31);
        cond |= gn ^ (gn >> 31);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint32_t)fn << 30;
            g.v[len - 2] |= (uint32_t)gn << 30;
            --len;
        }

        VERIFY_CHECK(++i < 25); /* We should never need more than 25*30 = 750 divsteps */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */

    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &SECP256K1_SIGNED30_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and f == modulus) */
    VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, -1) == 0 ||
                 secp256k1_modinv32_mul_cmp_30(&f, len, &SECP256K1_SIGNED30_ONE, 1) == 0 ||
                 (secp256k1_modinv32_mul_cmp_30(x, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&d, 9, &SECP256K1_SIGNED30_ONE, 0) == 0 &&
                  secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) == 0));

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv32_normalize_30(&d, f.v[len - 1], modinfo);
    *x = d;
}